

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscDecompiler.cpp
# Opt level: O2

void NscScriptDecompile(CNwnStream *sStream,uchar *pauchData,unsigned_long ulSize,
                       NscCompiler *pCompiler)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  size_t __n;
  char *pcVar11;
  byte *pbVar12;
  byte *pbVar13;
  float fVar14;
  char szByteText [128];
  char szOpType [32];
  char szOpText [512];
  char szText [1024];
  
  pbVar4 = pauchData + ulSize;
  pbVar6 = pauchData + 8;
  do {
    if (pbVar4 <= pbVar6) {
      return;
    }
    pbVar5 = pbVar6 + 1;
    uVar10 = (ulong)*pbVar6;
    pcVar11 = "RSADD";
    pcVar9 = "LOGAND";
    switch(*pbVar6) {
    case 1:
      pbVar13 = pbVar6 + 8;
      if ((pbVar4 < pbVar13) || (*pbVar5 != 1)) break;
      uVar3 = CNwnByteOrder<unsigned_int>::BigEndian(pbVar6 + 2);
      pcVar11 = (char *)(ulong)uVar3;
      pcVar9 = (char *)(ulong)(ushort)(*(ushort *)(pbVar6 + 6) << 8 | *(ushort *)(pbVar6 + 6) >> 8);
      sprintf(szByteText,"%02X 01 %08X %04X",1,pcVar11,pcVar9);
      pcVar7 = "CPDOWNSP %08X, %04X";
      goto LAB_00156f4b;
    case 2:
      goto switchD_00156b0c_caseD_2;
    case 3:
      pbVar13 = pbVar6 + 8;
      if ((pbVar13 <= pbVar4) && (*pbVar5 == 1)) {
        uVar3 = CNwnByteOrder<unsigned_int>::BigEndian(pbVar6 + 2);
        pcVar11 = (char *)(ulong)uVar3;
        pcVar9 = (char *)(ulong)(ushort)(*(ushort *)(pbVar6 + 6) << 8 | *(ushort *)(pbVar6 + 6) >> 8
                                        );
        sprintf(szByteText,"%02X 01 %08X %04X",3,pcVar11,pcVar9);
        pcVar7 = "CPTOPSP %08X, %04X";
        goto LAB_00156f4b;
      }
      break;
    case 4:
      pbVar12 = pbVar6 + 2;
      if (pbVar12 <= pbVar4) {
        bVar1 = *pbVar5;
        GetOpText(bVar1,szOpType);
        switch(bVar1) {
        case 3:
        case 6:
          pbVar13 = pbVar6 + 6;
          if (pbVar13 <= pbVar4) {
            uVar3 = CNwnByteOrder<unsigned_int>::BigEndian(pbVar12);
            pcVar9 = (char *)(ulong)uVar3;
            sprintf(szByteText,"%02X %02X %08X",4,(ulong)bVar1,pcVar9);
            pcVar7 = "CONST%s %08X";
            pcVar11 = szOpType;
            goto LAB_00156f4b;
          }
          break;
        case 4:
          pbVar13 = pbVar6 + 6;
          if (pbVar13 <= pbVar4) {
            fVar14 = CNwnByteOrder<float>::BigEndian(pbVar12);
            sprintf(szByteText,"%02X %02X %08X",4,4,(ulong)(uint)fVar14);
            sprintf(szOpText,"CONST%s %f",SUB84((double)fVar14,0),szOpType);
            goto LAB_001574c6;
          }
          break;
        case 5:
          pbVar13 = pbVar6 + 4;
          if ((pbVar13 <= pbVar4) &&
             (uVar8 = (ulong)(ushort)(*(ushort *)(pbVar6 + 2) << 8 | *(ushort *)(pbVar6 + 2) >> 8),
             pbVar5 + uVar8 + 3 <= pbVar4)) {
            __n = 0x80;
            if (uVar8 < 0x80) {
              __n = uVar8;
            }
            memmove(szText,pbVar13,__n);
            szText[__n] = '\0';
            sprintf(szByteText,"%02X %02X %04X str",4,5,uVar8);
            snprintf(szOpText,0x200,"CONST%s \"%s\"",szOpType,szText);
            pbVar13 = pbVar13 + uVar8;
            goto LAB_001574c6;
          }
        }
      }
      break;
    case 5:
      pbVar12 = pbVar6 + 5;
      if ((pbVar4 < pbVar12) || (*pbVar5 != 0)) break;
      uVar2 = *(ushort *)(pbVar6 + 2) << 8 | *(ushort *)(pbVar6 + 2) >> 8;
      pcVar11 = (char *)(ulong)uVar2;
      uVar8 = (ulong)pbVar6[4];
      pcVar9 = NscGetActionName((uint)uVar2,pCompiler);
      sprintf(szByteText,"%02X 00 %04X %02X",5,pcVar11,uVar8);
      pcVar7 = "ACTION %s(%04X), %02X";
      goto LAB_001574ba;
    case 6:
      goto switchD_00156b0c_caseD_6;
    case 7:
      pcVar9 = "LOGOR";
      goto switchD_00156b0c_caseD_6;
    case 8:
      pcVar9 = "INCOR";
      goto switchD_00156b0c_caseD_6;
    case 9:
      pcVar9 = "EXCOR";
      goto switchD_00156b0c_caseD_6;
    case 10:
      pcVar9 = "BOOLAND";
      goto switchD_00156b0c_caseD_6;
    case 0xb:
      pcVar9 = "EQUAL";
      goto switchD_00156b0c_caseD_6;
    case 0xc:
      pcVar9 = "NEQUAL";
      goto switchD_00156b0c_caseD_6;
    case 0xd:
      pcVar9 = "GEQ";
      goto switchD_00156b0c_caseD_6;
    case 0xe:
      pcVar9 = "GT";
      goto switchD_00156b0c_caseD_6;
    case 0xf:
      pcVar9 = "LT";
      goto switchD_00156b0c_caseD_6;
    case 0x10:
      pcVar9 = "LEQ";
      goto switchD_00156b0c_caseD_6;
    case 0x11:
      pcVar9 = "SHLEFT";
      goto switchD_00156b0c_caseD_6;
    case 0x12:
      pcVar9 = "SHRIGHT";
      goto switchD_00156b0c_caseD_6;
    case 0x13:
      pcVar9 = "USHRIGHT";
      goto switchD_00156b0c_caseD_6;
    case 0x14:
      pcVar9 = "ADD";
      goto switchD_00156b0c_caseD_6;
    case 0x15:
      pcVar9 = "SUB";
      goto switchD_00156b0c_caseD_6;
    case 0x16:
      pcVar9 = "MUL";
      goto switchD_00156b0c_caseD_6;
    case 0x17:
      pcVar9 = "DIV";
      goto switchD_00156b0c_caseD_6;
    case 0x18:
      pcVar9 = "MOD";
switchD_00156b0c_caseD_6:
      pbVar13 = pbVar6 + 2;
      if (pbVar4 < pbVar13) break;
      bVar1 = *pbVar5;
      GetOpText(bVar1,szOpType);
      if (bVar1 == 0x24) {
        pbVar12 = pbVar6 + 4;
        pbVar5 = pbVar13;
        if (pbVar4 < pbVar12) break;
        uVar8 = (ulong)(ushort)(*(ushort *)(pbVar6 + 2) << 8 | *(ushort *)(pbVar6 + 2) >> 8);
        sprintf(szByteText,"%02X %02X %04X",uVar10,0x24,uVar8);
        pcVar7 = "%s%s %04X";
        pcVar11 = szOpType;
LAB_001574ba:
        sprintf(szOpText,pcVar7,pcVar9,pcVar11,uVar8);
        pbVar13 = pbVar12;
      }
      else {
        sprintf(szByteText,"%02X %02X",uVar10,(ulong)bVar1);
        sprintf(szOpText,"%s%s",pcVar9,szOpType);
      }
      goto LAB_001574c6;
    case 0x19:
      pcVar11 = "NEG";
      goto switchD_00156b0c_caseD_2;
    case 0x1a:
      pcVar11 = "COMP";
      goto switchD_00156b0c_caseD_2;
    case 0x1b:
      pbVar13 = pbVar6 + 6;
      if ((pbVar4 < pbVar13) || (*pbVar5 != 0)) break;
      uVar3 = CNwnByteOrder<unsigned_int>::BigEndian(pbVar6 + 2);
      pbVar5 = (byte *)(ulong)uVar3;
      sprintf(szByteText,"%02X 00 %08X",0x1b,pbVar5);
      pcVar11 = "MOVSP %08X";
LAB_0015743f:
      sprintf(szOpText,pcVar11,pbVar5);
      goto LAB_001574c6;
    case 0x1c:
      pbVar13 = pbVar6 + 2;
      if (pbVar13 <= pbVar4) {
        pbVar5 = (byte *)(ulong)*pbVar5;
        sprintf(szByteText,"%02X %02X",0x1c,pbVar5);
        pcVar11 = "SAVE_STATEALL %02x";
        goto LAB_0015743f;
      }
      break;
    case 0x1d:
      if ((pbVar6 + 6 <= pbVar4) && (*pbVar5 == 0)) {
        uVar3 = CNwnByteOrder<unsigned_int>::BigEndian(pbVar6 + 2);
        sprintf(szByteText,"%02X 00 %08X",0x1d,(ulong)uVar3);
        pbVar5 = pbVar6 + ((ulong)uVar3 - (long)pauchData);
        pcVar11 = "JMP off_%08X";
LAB_0015705d:
        pbVar13 = pbVar6 + 6;
        goto LAB_0015743f;
      }
      break;
    case 0x1e:
      if ((pbVar6 + 6 <= pbVar4) && (*pbVar5 == 0)) {
        uVar3 = CNwnByteOrder<unsigned_int>::BigEndian(pbVar6 + 2);
        sprintf(szByteText,"%02X 00 %08X",0x1e,(ulong)uVar3);
        pbVar5 = pbVar6 + ((ulong)uVar3 - (long)pauchData);
        pcVar11 = "JSR fn_%08X";
        goto LAB_0015705d;
      }
      break;
    case 0x1f:
      if ((pbVar6 + 6 <= pbVar4) && (*pbVar5 == 0)) {
        uVar3 = CNwnByteOrder<unsigned_int>::BigEndian(pbVar6 + 2);
        sprintf(szByteText,"%02X 00 %08X",0x1f,(ulong)uVar3);
        pbVar5 = pbVar6 + ((ulong)uVar3 - (long)pauchData);
        pcVar11 = "JZ off_%08X";
        goto LAB_0015705d;
      }
      break;
    case 0x20:
      pbVar13 = pbVar6 + 2;
      if ((pbVar13 <= pbVar4) && (*pbVar5 == 0)) {
        sprintf(szByteText,"%02X 00",0x20);
        builtin_strncpy(szOpText,"RETN",5);
        goto LAB_001574c6;
      }
      break;
    case 0x21:
      pbVar12 = pbVar6 + 8;
      if ((pbVar12 <= pbVar4) && (*pbVar5 == 1)) {
        pcVar9 = (char *)(ulong)(ushort)(*(ushort *)(pbVar6 + 2) << 8 | *(ushort *)(pbVar6 + 2) >> 8
                                        );
        pcVar11 = (char *)(ulong)(ushort)(*(ushort *)(pbVar6 + 4) << 8 |
                                         *(ushort *)(pbVar6 + 4) >> 8);
        uVar8 = (ulong)(ushort)(*(ushort *)(pbVar6 + 6) << 8 | *(ushort *)(pbVar6 + 6) >> 8);
        sprintf(szByteText,"%02X 01 %04X %04X %04x",0x21,pcVar9,pcVar11,uVar8);
        pcVar7 = "DESTRUCT %04X, %04X, %04X";
        goto LAB_001574ba;
      }
      break;
    case 0x22:
      pcVar11 = "NOT";
switchD_00156b0c_caseD_2:
      pbVar13 = pbVar6 + 2;
      if (pbVar4 < pbVar13) break;
      bVar1 = *pbVar5;
      pcVar9 = szOpType;
      GetOpText(bVar1,pcVar9);
      sprintf(szByteText,"%02X %02X",uVar10,(ulong)bVar1);
      pcVar7 = "%s%s";
LAB_00156f4b:
      sprintf(szOpText,pcVar7,pcVar11,pcVar9);
      goto LAB_001574c6;
    case 0x23:
      pbVar13 = pbVar6 + 6;
      if ((pbVar13 <= pbVar4) && (*pbVar5 == 3)) {
        uVar3 = CNwnByteOrder<unsigned_int>::BigEndian(pbVar6 + 2);
        pbVar5 = (byte *)(ulong)uVar3;
        sprintf(szByteText,"%02X 03 %08X",0x23,pbVar5);
        pcVar11 = "DECISP %08X";
        goto LAB_0015743f;
      }
      break;
    case 0x24:
      pbVar13 = pbVar6 + 6;
      if ((pbVar13 <= pbVar4) && (*pbVar5 == 3)) {
        uVar3 = CNwnByteOrder<unsigned_int>::BigEndian(pbVar6 + 2);
        pbVar5 = (byte *)(ulong)uVar3;
        sprintf(szByteText,"%02X 03 %08X",0x24,pbVar5);
        pcVar11 = "INCISP %08X";
        goto LAB_0015743f;
      }
      break;
    case 0x25:
      if ((pbVar6 + 6 <= pbVar4) && (*pbVar5 == 0)) {
        uVar3 = CNwnByteOrder<unsigned_int>::BigEndian(pbVar6 + 2);
        sprintf(szByteText,"%02X 00 %08X",0x25,(ulong)uVar3);
        pbVar5 = pbVar6 + ((ulong)uVar3 - (long)pauchData);
        pcVar11 = "JNZ off_%08X";
        goto LAB_0015705d;
      }
      break;
    case 0x26:
      pbVar13 = pbVar6 + 8;
      if ((pbVar13 <= pbVar4) && (*pbVar5 == 1)) {
        uVar3 = CNwnByteOrder<unsigned_int>::BigEndian(pbVar6 + 2);
        pcVar11 = (char *)(ulong)uVar3;
        pcVar9 = (char *)(ulong)(ushort)(*(ushort *)(pbVar6 + 6) << 8 | *(ushort *)(pbVar6 + 6) >> 8
                                        );
        sprintf(szByteText,"%02X 01 %08X %04X",0x26,pcVar11,pcVar9);
        pcVar7 = "CPDOWNBP %08X, %04X";
        goto LAB_00156f4b;
      }
      break;
    case 0x27:
      pbVar13 = pbVar6 + 8;
      if ((pbVar13 <= pbVar4) && (*pbVar5 == 1)) {
        uVar3 = CNwnByteOrder<unsigned_int>::BigEndian(pbVar6 + 2);
        pcVar11 = (char *)(ulong)uVar3;
        pcVar9 = (char *)(ulong)(ushort)(*(ushort *)(pbVar6 + 6) << 8 | *(ushort *)(pbVar6 + 6) >> 8
                                        );
        sprintf(szByteText,"%02X 01 %08X %04X",0x27,pcVar11,pcVar9);
        pcVar7 = "CPTOPBP %08X, %04X";
        goto LAB_00156f4b;
      }
      break;
    case 0x28:
      pbVar13 = pbVar6 + 6;
      if ((pbVar13 <= pbVar4) && (*pbVar5 == 3)) {
        uVar3 = CNwnByteOrder<unsigned_int>::BigEndian(pbVar6 + 2);
        pbVar5 = (byte *)(ulong)uVar3;
        sprintf(szByteText,"%02X 03 %08X",0x28,pbVar5);
        pcVar11 = "DECIBP %08X";
        goto LAB_0015743f;
      }
      break;
    case 0x29:
      pbVar13 = pbVar6 + 6;
      if ((pbVar13 <= pbVar4) && (*pbVar5 == 3)) {
        uVar3 = CNwnByteOrder<unsigned_int>::BigEndian(pbVar6 + 2);
        pbVar5 = (byte *)(ulong)uVar3;
        sprintf(szByteText,"%02X 03 %08X",0x29,pbVar5);
        pcVar11 = "INCIBP %08X";
        goto LAB_0015743f;
      }
      break;
    case 0x2a:
      pbVar13 = pbVar6 + 2;
      if ((pbVar13 <= pbVar4) && (*pbVar5 == 0)) {
        sprintf(szByteText,"%02X 00",0x2a);
        builtin_strncpy(szOpText,"SAVEBP",7);
        goto LAB_001574c6;
      }
      break;
    case 0x2b:
      pbVar13 = pbVar6 + 2;
      if ((pbVar13 <= pbVar4) && (*pbVar5 == 0)) {
        sprintf(szByteText,"%02X 00",0x2b);
        builtin_strncpy(szOpText,"RESTOREBP",10);
        goto LAB_001574c6;
      }
      break;
    case 0x2c:
      pbVar12 = pbVar6 + 10;
      if (pbVar12 <= pbVar4) {
        pcVar9 = (char *)(ulong)pbVar6[1];
        uVar3 = CNwnByteOrder<unsigned_int>::BigEndian(pbVar6 + 2);
        pcVar11 = (char *)(ulong)uVar3;
        uVar3 = CNwnByteOrder<unsigned_int>::BigEndian(pbVar6 + 6);
        uVar8 = (ulong)uVar3;
        sprintf(szByteText,"%02X %02X %08X %08X",0x2c,pcVar9,pcVar11,uVar8);
        pcVar7 = "STORE_STATE %02X, %08X, %08X";
        goto LAB_001574ba;
      }
      break;
    case 0x2d:
      if ((pbVar6 + 2 <= pbVar4) && (*pbVar5 == 0)) {
        sprintf(szByteText,"%02X 00",0x2d);
        builtin_strncpy(szOpText,"NOP",4);
        pbVar13 = pbVar6 + 2;
        goto LAB_001574c6;
      }
      break;
    case 0x42:
      pbVar13 = pbVar6 + 5;
      if (pbVar13 <= pbVar4) {
        uVar3 = CNwnByteOrder<unsigned_int>::BigEndian(pbVar5);
        pbVar5 = (byte *)(ulong)uVar3;
        sprintf(szByteText,"%02X %08X",0x42,pbVar5);
        pcVar11 = "T %08X";
        goto LAB_0015743f;
      }
    }
    sprintf(szByteText,"%02X",uVar10);
    szOpText[0] = '?';
    szOpText[1] = '?';
    szOpText[2] = '\0';
    pbVar13 = pbVar5;
LAB_001574c6:
    sprintf(szText,"%08X %-24s %s",(long)pbVar6 - (long)pauchData,szByteText,szOpText);
    (*sStream->_vptr_CNwnStream[6])(sStream,szText,1);
    pbVar6 = pbVar13;
  } while( true );
}

Assistant:

void NscScriptDecompile (CNwnStream &sStream, 
	unsigned char *pauchData, unsigned long ulSize, NscCompiler *pCompiler)
{

	//
	// Loop through the data
	//

	unsigned char *pStart = pauchData;
	unsigned char *pEnd = &pauchData [ulSize];
	unsigned char *pData = pStart;
	pData += 8;
	while (pData < pEnd)
	{
		char szByteText [128];
		char szOpText [512];
		char szOpType [32];
		char *pszOpRoot;

		//
		// Switch based on the next opcode
		//

		unsigned char *pOp = pData;
		unsigned char cOp = *pData++;
		switch (cOp)
		{

			case NscCode_CPDOWNSP:
				{
					if (&pData [7] > pEnd || pData [0] != 1)
						goto invalid_op;
					unsigned long ul1, ul2;
					pData = GetUINT32 (pData + 1, &ul1);
					pData = GetUINT16 (pData, &ul2);
					sprintf (szByteText, "%02X 01 %08X %04X", cOp, ul1, ul2);
					sprintf (szOpText, "CPDOWNSP %08X, %04X", ul1, ul2);
				}
				break;

			case NscCode_RSADD:
				pszOpRoot = "RSADD";
do_simple_operator:;
				{
					if (&pData [1] > pEnd)
						goto invalid_op;
					unsigned char cOpType = *pData++;
					GetOpText (cOpType, szOpType);
					sprintf (szByteText, "%02X %02X", cOp, cOpType);
					sprintf (szOpText, "%s%s", pszOpRoot, szOpType);
				}
				break;

			case NscCode_CPTOPSP:
				{
					if (&pData [7] > pEnd || pData [0] != 1)
						goto invalid_op;
					unsigned long ul1, ul2;
					pData = GetUINT32 (pData + 1, &ul1);
					pData = GetUINT16 (pData, &ul2);
					sprintf (szByteText, "%02X 01 %08X %04X", cOp, ul1, ul2);
					sprintf (szOpText, "CPTOPSP %08X, %04X", ul1, ul2);
				}
				break;

			case NscCode_CONST:
				{
					if (&pData [1] > pEnd)
						goto invalid_op;
					unsigned char cOpType = *pData;
					GetOpText (cOpType, szOpType);
					switch (cOpType)
					{
						case 3:
						case 6:
							{
								if (&pData [5] > pEnd)
									goto invalid_op;
								unsigned long ul;
								pData = GetUINT32 (pData + 1, &ul);
								sprintf (szByteText, "%02X %02X %08X", cOp, cOpType, ul);
								sprintf (szOpText, "CONST%s %08X", szOpType, ul);
							}
							break;

						case 4:
							{
								if (&pData [5] > pEnd)
									goto invalid_op;
								union
								{
									unsigned long ul;
									float f;
								} val;
								pData = GetFLOAT (pData + 1, &val .f);
								sprintf (szByteText, "%02X %02X %08X", cOp, cOpType, val .ul);
								sprintf (szOpText, "CONST%s %f", szOpType, val .f);
							}
							break;

						case 5:
							{
								if (&pData [3] > pEnd)
									goto invalid_op;
								unsigned long ul;
								GetUINT16 (pData + 1, &ul);
								if (&pData [3 + ul] > pEnd)
									goto invalid_op;
								pData += 3;
								char szValue [129];
								unsigned long ulCopy = ul > 128 ? 128 : ul;
								memmove (szValue, pData, ulCopy);
								szValue [ulCopy] = 0;
								sprintf (szByteText, "%02X %02X %04X str", cOp, cOpType, ul);
								snprintf (szOpText, _countof (szOpText), 
									"CONST%s \"%s\"", szOpType, szValue);
								pData += ul;
							}
							break;

						default:
							goto invalid_op;
					}
				}
				break;

			case NscCode_ACTION:
				{
					if (&pData [4] > pEnd || pData [0] != 0)
						goto invalid_op;
					unsigned long ul1, ul2;
					pData = GetUINT16 (pData + 1, &ul1);
					ul2 = *pData++;
					const char *pszName = NscGetActionName ((int) ul1, pCompiler);
					sprintf (szByteText, "%02X 00 %04X %02X", cOp, ul1, ul2);
					sprintf (szOpText, "ACTION %s(%04X), %02X", pszName, ul1, ul2);
				}
				break;

			case NscCode_LOGAND:
				pszOpRoot = "LOGAND";
do_binary_operator:;
				{
					if (&pData [1] > pEnd)
						goto invalid_op;
					unsigned char cOpType = *pData++;
					GetOpText (cOpType, szOpType);
					if (cOpType == 0x24)
					{
						if (&pData [2] > pEnd)
							goto invalid_op;
						unsigned long ul1;
						pData = GetUINT16 (pData, &ul1);
						sprintf (szByteText, "%02X %02X %04X", cOp, cOpType, ul1);
						sprintf (szOpText, "%s%s %04X", pszOpRoot, szOpType, ul1);
					}
					else
					{
						sprintf (szByteText, "%02X %02X", cOp, cOpType);
						sprintf (szOpText, "%s%s", pszOpRoot, szOpType);
					}
				}
				break;

			case NscCode_LOGOR:
				pszOpRoot = "LOGOR";
				goto do_binary_operator;

			case NscCode_INCOR:
				pszOpRoot = "INCOR";
				goto do_binary_operator;

			case NscCode_EXCOR:
				pszOpRoot = "EXCOR";
				goto do_binary_operator;

			case NscCode_BOOLAND:
				pszOpRoot = "BOOLAND";
				goto do_binary_operator;

			case NscCode_EQUAL:
				pszOpRoot = "EQUAL";
				goto do_binary_operator;

			case NscCode_NEQUAL:
				pszOpRoot = "NEQUAL";
				goto do_binary_operator;

			case NscCode_GEQ:
				pszOpRoot = "GEQ";
				goto do_binary_operator;

			case NscCode_GT:
				pszOpRoot = "GT";
				goto do_binary_operator;

			case NscCode_LT:
				pszOpRoot = "LT";
				goto do_binary_operator;

			case NscCode_LEQ:
				pszOpRoot = "LEQ";
				goto do_binary_operator;

			case NscCode_SHLEFT:
				pszOpRoot = "SHLEFT";
				goto do_binary_operator;

			case NscCode_SHRIGHT:
				pszOpRoot = "SHRIGHT";
				goto do_binary_operator;

			case NscCode_USHRIGHT:
				pszOpRoot = "USHRIGHT";
				goto do_binary_operator;

			case NscCode_ADD:
				pszOpRoot = "ADD";
				goto do_binary_operator;

			case NscCode_SUB:
				pszOpRoot = "SUB";
				goto do_binary_operator;

			case NscCode_MUL:
				pszOpRoot = "MUL";
				goto do_binary_operator;

			case NscCode_DIV:
				pszOpRoot = "DIV";
				goto do_binary_operator;

			case NscCode_MOD:
				pszOpRoot = "MOD";
				goto do_binary_operator;

			case NscCode_NEG:
				pszOpRoot = "NEG";
				goto do_simple_operator;

			case NscCode_COMP:
				pszOpRoot = "COMP";
				goto do_simple_operator;

			case NscCode_MOVSP:
				{
					if (&pData [5] > pEnd || pData [0] != 0)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 00 %08X", cOp, ul1);
					sprintf (szOpText, "MOVSP %08X", ul1);
				}
				break;

			case NscCode_STORE_STATEALL:
				{
					if (&pData [1] > pEnd)
						goto invalid_op;
					unsigned long ul = *pData++;
					sprintf (szByteText, "%02X %02X", cOp, ul);
					sprintf (szOpText, "SAVE_STATEALL %02x", ul);
				}
				break;

			case NscCode_JMP:
				{
					if (&pData [5] > pEnd || pData [0] != 0)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 00 %08X", cOp, ul1);
					sprintf (szOpText, "JMP off_%08X", (pOp - pStart) + ul1);
				}
				break;

			case NscCode_JSR:
				{
					if (&pData [5] > pEnd || pData [0] != 0)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 00 %08X", cOp, ul1);
					sprintf (szOpText, "JSR fn_%08X", (pOp - pStart) + ul1);
				}
				break;

			case NscCode_JZ:
				{
					if (&pData [5] > pEnd || pData [0] != 0)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 00 %08X", cOp, ul1);
					sprintf (szOpText, "JZ off_%08X", (pOp - pStart) + ul1);
				}
				break;

			case NscCode_RETN:
				{
					if (&pData [1] > pEnd || pData [0] != 0)
						goto invalid_op;
					pData++;
					sprintf (szByteText, "%02X 00", cOp);
					sprintf (szOpText, "RETN");
				}
				break;

			case NscCode_DESTRUCT:
				{
					if (&pData [7] > pEnd || pData [0] != 1)
						goto invalid_op;
					unsigned long ul1, ul2, ul3;
					pData = GetUINT16 (pData + 1, &ul1);
					pData = GetUINT16 (pData, &ul2);
					pData = GetUINT16 (pData, &ul3);
					sprintf (szByteText, "%02X 01 %04X %04X %04x", cOp, ul1, ul2, ul3);
					sprintf (szOpText, "DESTRUCT %04X, %04X, %04X", ul1, ul2, ul3);
					// First parameter, number of bytes to destroy
					// Second parameter, offset of element not to destroy
					// Third parameter, number of bytes no to destroy
				}
				break;

			case NscCode_NOT:
				pszOpRoot = "NOT";
				goto do_simple_operator;

			case NscCode_DECISP:
				{
					if (&pData [5] > pEnd || pData [0] != 3)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 03 %08X", cOp, ul1);
					sprintf (szOpText, "DECISP %08X", ul1);
				}
				break;

			case NscCode_INCISP:
				{
					if (&pData [5] > pEnd || pData [0] != 3)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 03 %08X", cOp, ul1);
					sprintf (szOpText, "INCISP %08X", ul1);
				}
				break;

			case NscCode_JNZ:
				{
					if (&pData [5] > pEnd || pData [0] != 0)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 00 %08X", cOp, ul1);
					sprintf (szOpText, "JNZ off_%08X", (pOp - pStart) + ul1);
				}
				break;

			case NscCode_CPDOWNBP:
				{
					if (&pData [7] > pEnd || pData [0] != 1)
						goto invalid_op;
					unsigned long ul1, ul2;
					pData = GetUINT32 (pData + 1, &ul1);
					pData = GetUINT16 (pData, &ul2);
					sprintf (szByteText, "%02X 01 %08X %04X", cOp, ul1, ul2);
					sprintf (szOpText, "CPDOWNBP %08X, %04X", ul1, ul2);
				}
				break;

			case NscCode_CPTOPBP:
				{
					if (&pData [7] > pEnd || pData [0] != 1)
						goto invalid_op;
					unsigned long ul1, ul2;
					pData = GetUINT32 (pData + 1, &ul1);
					pData = GetUINT16 (pData, &ul2);
					sprintf (szByteText, "%02X 01 %08X %04X", cOp, ul1, ul2);
					sprintf (szOpText, "CPTOPBP %08X, %04X", ul1, ul2);
				}
				break;

			case NscCode_DECIBP:
				{
					if (&pData [5] > pEnd || pData [0] != 3)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 03 %08X", cOp, ul1);
					sprintf (szOpText, "DECIBP %08X", ul1);
				}
				break;

			case NscCode_INCIBP:
				{
					if (&pData [5] > pEnd || pData [0] != 3)
						goto invalid_op;
					unsigned long ul1;
					pData = GetUINT32 (pData + 1, &ul1);
					sprintf (szByteText, "%02X 03 %08X", cOp, ul1);
					sprintf (szOpText, "INCIBP %08X", ul1);
				}
				break;

			case NscCode_SAVEBP:
				{
					if (&pData [1] > pEnd || pData [0] != 0)
						goto invalid_op;
					pData++;
					sprintf (szByteText, "%02X 00", cOp);
					sprintf (szOpText, "SAVEBP");
				}
				break;

			case NscCode_RESTOREBP:
				{
					if (&pData [1] > pEnd || pData [0] != 0)
						goto invalid_op;
					pData++;
					sprintf (szByteText, "%02X 00", cOp);
					sprintf (szOpText, "RESTOREBP");
				}
				break;

			case NscCode_STORE_STATE:
				{
					if (&pData [9] > pEnd)
						goto invalid_op;
					unsigned long ul1, ul2, ul3;
					ul3 = *pData++;
					pData = GetUINT32 (pData, &ul1);
					pData = GetUINT32 (pData, &ul2);
					sprintf (szByteText, "%02X %02X %08X %08X", cOp, ul3, ul1, ul2);
					sprintf (szOpText, "STORE_STATE %02X, %08X, %08X", ul3, ul1, ul2);
				    // First value is BP stack size to save
					// second value is SP stack size to save
				}
				break;

			case NscCode_NOP:
				{
					if (&pData [1] > pEnd || pData [0] != 0)
						goto invalid_op;
					pData++;
					sprintf (szByteText, "%02X 00", cOp);
					sprintf (szOpText, "NOP");
				}
				break;

			case NscCode_Size:
				{
					if (&pData [4] > pEnd)
						goto invalid_op;
					unsigned long ul;
					pData = GetUINT32 (pData, &ul);
					sprintf (szByteText, "%02X %08X", cOp, ul);
					sprintf (szOpText, "T %08X", ul);
				}
				break;

			default:
invalid_op:;
				sprintf (szByteText, "%02X", cOp);
				sprintf (szOpText, "??");
				//if (g_fpDebug)
				//	fprintf (g_fpDebug, "Unknown opcode %02x\r\n", cOp);
				break;
		}

		//
		// Format the final line
		//

		char szText [1024];
		sprintf (szText, "%08X %-24s %s", pOp - pStart, szByteText, szOpText);
		sStream .WriteLine (szText);
	}
}